

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db.c
# Opt level: O0

void sort_areas(void)

{
  AREA_DATA_conflict *pAVar1;
  bool bVar2;
  bool bVar3;
  int vnum;
  bool first;
  bool sorted;
  AREA_DATA_conflict *pArea;
  AREA_DATA_conflict *placeholder;
  
  bVar2 = false;
  vnum = 0;
  while (!bVar2) {
    bVar2 = true;
    for (pArea = area_first;
        (pArea != (AREA_DATA_conflict *)0x0 && (pArea->next != (AREA_DATA_conflict *)0x0));
        pArea = pArea->next) {
      bVar3 = pArea == area_first;
      if (pArea->next->min_vnum < pArea->min_vnum) {
        bVar2 = false;
        if (pArea->next->next != (AREA_DATA_conflict *)0x0) {
          pArea->next->next->prev = pArea;
        }
        pArea->next->prev = pArea->prev;
        if (!bVar3) {
          pArea->prev->next = pArea->next;
        }
        pArea->prev = pArea->next;
        pAVar1 = pArea->next->next;
        pArea->next->next = pArea;
        pArea->next = pAVar1;
        if (bVar3) {
          area_first = pArea->prev;
        }
      }
    }
  }
  for (pArea = area_first; pArea != (AREA_DATA_conflict *)0x0; pArea = pArea->next) {
    pArea->vnum = vnum;
    vnum = vnum + 1;
  }
  return;
}

Assistant:

void sort_areas(void)
{
	AREA_DATA *placeholder;
	AREA_DATA *pArea;
	bool sorted= false;
	bool first= false;
	int vnum = 0;

	while (!sorted)
	{
		sorted = true;

		for (pArea = area_first; pArea; pArea = pArea->next)
		{
			first= false;

			if (!pArea->next)
				break;

			if (pArea == area_first)
				first = true;

			if (pArea->min_vnum > pArea->next->min_vnum)
			{
				sorted= false;

				if (pArea->next->next)
					pArea->next->next->prev = pArea;

				pArea->next->prev = pArea->prev;

				if (!first)
					pArea->prev->next = pArea->next;

				pArea->prev = pArea->next;
				placeholder = pArea->next->next;
				pArea->next->next = pArea;
				pArea->next = placeholder;

				if (first)
					area_first = pArea->prev;
			}
		}
	}

	for (pArea = area_first; pArea; pArea = pArea->next)
	{
		pArea->vnum = vnum;
		vnum++;
	}
}